

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<unsigned_int,char,char>
          (InternalException *this,string *msg,uint params,char params_1,char params_2)

{
  undefined3 in_register_00000009;
  undefined4 in_register_00000014;
  char in_R9B;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,char,char>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             CONCAT31(in_register_00000009,params_1),params_2,in_R9B);
  InternalException(this,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}